

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdatabuilder.cpp
# Opt level: O3

int32_t __thiscall
icu_63::CollationDataBuilder::addCE32
          (CollationDataBuilder *this,uint32_t ce32,UErrorCode *errorCode)

{
  int32_t *piVar1;
  int iVar2;
  UBool UVar3;
  int iVar4;
  long lVar5;
  
  iVar2 = (this->ce32s).count;
  if (0 < (long)iVar2) {
    lVar5 = 0;
    do {
      if ((this->ce32s).elements[lVar5] == ce32) {
        return (int32_t)lVar5;
      }
      lVar5 = lVar5 + 1;
    } while (iVar2 != lVar5);
  }
  if ((iVar2 < -1) || (iVar4 = iVar2, (this->ce32s).capacity <= iVar2)) {
    UVar3 = UVector32::expandCapacity(&this->ce32s,iVar2 + 1,errorCode);
    if (UVar3 == '\0') {
      return iVar2;
    }
    iVar4 = (this->ce32s).count;
  }
  (this->ce32s).elements[iVar4] = ce32;
  piVar1 = &(this->ce32s).count;
  *piVar1 = *piVar1 + 1;
  return iVar2;
}

Assistant:

int32_t
CollationDataBuilder::addCE32(uint32_t ce32, UErrorCode &errorCode) {
    int32_t length = ce32s.size();
    for(int32_t i = 0; i < length; ++i) {
        if(ce32 == (uint32_t)ce32s.elementAti(i)) { return i; }
    }
    ce32s.addElement((int32_t)ce32, errorCode);  
    return length;
}